

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn64.c
# Opt level: O3

void uc_init_sparc64(uc_struct_conflict8 *uc)

{
  uc->release = sparc_release;
  uc->reg_read_sparc = reg_read_sparc64;
  uc->reg_write_sparc = reg_write_sparc64;
  uc->reg_reset = reg_reset;
  uc->set_pc = sparc_set_pc;
  uc->get_pc = sparc_get_pc;
  uc->stop_interrupt = sparc_stop_interrupt;
  uc->cpus_init = sparc_cpus_init;
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init_sparc = tcg_exec_init_sparc64;
  uc->cpu_exec_init_all_sparc = cpu_exec_init_all_sparc64;
  uc->vm_start_sparc = vm_start_sparc64;
  uc->memory_map_sparc = memory_map_sparc64;
  uc->memory_map_ptr_sparc = memory_map_ptr_sparc64;
  uc->memory_unmap_sparc = memory_unmap_sparc64;
  uc->memory_moveout_sparc = memory_moveout_sparc64;
  uc->memory_movein_sparc = memory_movein_sparc64;
  uc->readonly_mem = memory_region_set_readonly_sparc64;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_sparc64;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_sparc64;
  uc->memory_map_io_sparc = memory_map_io_sparc64;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_sparc64;
  uc->memory_filter_subregions = memory_region_filter_subregions_sparc64;
  uc->memory_cow_sparc = memory_cow_sparc64;
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->release = sparc_release;
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->set_pc = sparc_set_pc;
    uc->get_pc = sparc_get_pc;
    uc->stop_interrupt = sparc_stop_interrupt;
    uc->cpus_init = sparc_cpus_init;
    uc_common_init(uc);
}